

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_16;
  ostringstream error_message_15;
  BlockCopyWrapper block_copy;
  istream *input_stream;
  ostringstream error_message_14;
  ifstream ifs;
  ostringstream error_message_13;
  ostringstream error_message_12;
  string str;
  char *arg;
  int i;
  char *input_file;
  ostringstream error_message_11;
  int copy_length;
  ostringstream error_message_10;
  ostringstream error_message_9;
  ostringstream error_message_8;
  ostringstream error_message_7;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool is_output_block_length_specified;
  bool is_input_end_number_specified;
  string data_type;
  double pad_value;
  int output_block_length;
  int output_start_number;
  int input_block_length;
  int input_end_number;
  int input_start_number;
  undefined4 in_stack_ffffffffffffddf8;
  undefined4 in_stack_ffffffffffffddfc;
  BlockCopyWrapper *in_stack_ffffffffffffde00;
  string *in_stack_ffffffffffffde08;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffde10;
  int in_stack_ffffffffffffde14;
  char *local_21d8;
  double in_stack_ffffffffffffded0;
  undefined8 in_stack_ffffffffffffded8;
  undefined8 in_stack_ffffffffffffdee0;
  string *in_stack_ffffffffffffdee8;
  BlockCopyWrapper *in_stack_ffffffffffffdef0;
  char *in_stack_ffffffffffffdf00;
  bool local_20da;
  bool local_20ba;
  bool local_2092;
  bool local_206a;
  bool local_204a;
  bool local_2022;
  allocator *in_stack_ffffffffffffdfe8;
  string *in_stack_ffffffffffffdff0;
  bool local_1ffa;
  allocator local_1fc1;
  string local_1fc0 [32];
  ostringstream local_1fa0 [224];
  ostream *in_stack_ffffffffffffe140;
  allocator local_1e21;
  string local_1e20 [32];
  ostringstream local_1e00 [376];
  BlockCopyWrapper local_1c88;
  char *local_1c80;
  allocator local_1c71;
  string local_1c70 [32];
  ostringstream local_1c50 [376];
  char local_1ad8 [527];
  allocator local_18c9;
  string local_18c8 [32];
  ostringstream local_18a8 [383];
  allocator local_1729;
  string local_1728 [32];
  ostringstream local_1708 [376];
  string local_1590 [39];
  allocator local_1569;
  string local_1568 [32];
  char *local_1548;
  int local_153c;
  char *local_1538;
  allocator local_1529;
  string local_1528 [32];
  ostringstream local_1508 [376];
  int local_1390;
  allocator local_1389;
  string local_1388 [32];
  ostringstream local_1368 [383];
  allocator local_11e9;
  string local_11e8 [32];
  ostringstream local_11c8 [383];
  allocator local_1049;
  string local_1048 [32];
  ostringstream local_1028 [383];
  allocator local_ea9;
  string local_ea8 [32];
  ostringstream local_e88 [383];
  allocator local_d09;
  string local_d08 [39];
  allocator local_ce1;
  string local_ce0 [32];
  ostringstream local_cc0 [383];
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  ostringstream local_930 [383];
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [32];
  ostringstream local_768 [383];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  ostringstream local_5a0 [383];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  ostringstream local_3d8 [383];
  allocator local_259;
  string local_258 [32];
  undefined4 local_238;
  allocator local_231;
  string local_230 [32];
  ostringstream local_210 [383];
  allocator local_91;
  string local_90 [36];
  int local_6c;
  byte local_66;
  byte local_65;
  allocator local_51;
  string local_50 [32];
  undefined8 local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  pcVar1 = (anonymous_namespace)::kDefaultDataType;
  local_4 = 0;
  local_14 = 0;
  local_18 = 0x1ff;
  local_1c = 0x200;
  local_20 = 0;
  local_24 = 0x200;
  local_30 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_65 = 0;
  local_66 = 0;
LAB_00104824:
  local_6c = ya_getopt_long(in_stack_ffffffffffffde14,(char **)in_stack_ffffffffffffde08,
                            (char *)in_stack_ffffffffffffde00,
                            (option *)CONCAT44(in_stack_ffffffffffffddfc,in_stack_ffffffffffffddf8),
                            (int *)0x104847);
  pcVar1 = ya_optarg;
  if (local_6c == -1) {
    if ((local_65 & 1) == 0) {
      local_18 = local_1c + -1;
    }
    else {
      if (local_1c <= local_18) {
        std::__cxx11::ostringstream::ostringstream(local_1028);
        poVar5 = std::operator<<((ostream *)local_1028,"End number ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        poVar5 = std::operator<<(poVar5," must be less than block length ");
        std::ostream::operator<<(poVar5,local_1c);
        paVar6 = &local_1049;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1048,"bcp",paVar6);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
        std::__cxx11::string::~string(local_1048);
        std::allocator<char>::~allocator((allocator<char> *)&local_1049);
        local_4 = 1;
        local_238 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1028);
        goto LAB_00106ad2;
      }
      if (local_18 < local_14) {
        std::__cxx11::ostringstream::ostringstream(local_11c8);
        poVar5 = std::operator<<((ostream *)local_11c8,"End number ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        poVar5 = std::operator<<(poVar5," must be equal to or greater than start number ");
        std::ostream::operator<<(poVar5,local_14);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11e8,"bcp",&local_11e9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
        std::__cxx11::string::~string(local_11e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
        local_4 = 1;
        local_238 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_11c8);
        goto LAB_00106ad2;
      }
    }
    if (local_1c <= local_14) {
      std::__cxx11::ostringstream::ostringstream(local_1368);
      poVar5 = std::operator<<((ostream *)local_1368,"Start number ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
      poVar5 = std::operator<<(poVar5," must be less than block length ");
      std::ostream::operator<<(poVar5,local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1388,"bcp",&local_1389);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_1388);
      std::allocator<char>::~allocator((allocator<char> *)&local_1389);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1368);
      goto LAB_00106ad2;
    }
    local_1390 = (local_18 - local_14) + 1;
    if ((local_66 & 1) == 0) {
      local_24 = local_20 + local_1390;
    }
    else if (local_24 < local_20 + local_1390) {
      std::__cxx11::ostringstream::ostringstream(local_1508);
      std::operator<<((ostream *)local_1508,"Output block length is too short");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1528,"bcp",&local_1529);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_1528);
      std::allocator<char>::~allocator((allocator<char> *)&local_1529);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1508);
      goto LAB_00106ad2;
    }
    local_1538 = (char *)0x0;
    local_153c = local_8 - ya_optind;
    goto LAB_001061c2;
  }
  switch(local_6c) {
  case 0x4c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_978,pcVar1,&local_979);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_20ba = !bVar2 || local_24 < 1;
    std::__cxx11::string::~string(local_978);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
    if (local_20ba) {
      std::__cxx11::ostringstream::ostringstream(local_af8);
      std::operator<<((ostream *)local_af8,
                      "The argument for the -L option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b18,"bcp",&local_b19);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_b18);
      std::allocator<char>::~allocator((allocator<char> *)&local_b19);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_af8);
      goto LAB_00106ad2;
    }
    local_66 = 1;
    goto LAB_00104824;
  case 0x4d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b40,pcVar1,&local_b41);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_20da = !bVar2 || local_24 < 0;
    std::__cxx11::string::~string(local_b40);
    std::allocator<char>::~allocator((allocator<char> *)&local_b41);
    if (local_20da) {
      std::__cxx11::ostringstream::ostringstream(local_cc0);
      poVar5 = std::operator<<((ostream *)local_cc0,"The argument for the -M option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ce0,"bcp",&local_ce1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_ce0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_cc0);
      goto LAB_00106ad2;
    }
    local_24 = local_24 + 1;
    local_66 = 1;
    goto LAB_00104824;
  default:
    anon_unknown.dwarf_c7e9::PrintUsage(in_stack_ffffffffffffe140);
    local_4 = 1;
    local_238 = 1;
    goto LAB_00106ad2;
  case 0x53:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7b0,pcVar1,&local_7b1);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_2092 = !bVar2 || local_20 < 0;
    std::__cxx11::string::~string(local_7b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    if (local_2092) {
      std::__cxx11::ostringstream::ostringstream(local_930);
      poVar5 = std::operator<<((ostream *)local_930,"The argument for the -S option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,"bcp",&local_951);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_930);
      goto LAB_00106ad2;
    }
    goto LAB_00104824;
  case 0x65:
    in_stack_ffffffffffffdfe8 = &local_259;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,pcVar1,in_stack_ffffffffffffdfe8);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_2022 = !bVar2 || local_18 < 0;
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    if (local_2022) {
      std::__cxx11::ostringstream::ostringstream(local_3d8);
      poVar5 = std::operator<<((ostream *)local_3d8,"The argument for the -e option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"bcp",&local_3f9);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_3d8);
      goto LAB_00106ad2;
    }
    local_65 = 1;
    goto LAB_00104824;
  case 0x66:
    in_stack_ffffffffffffdf00 = ya_optarg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d08,in_stack_ffffffffffffdf00,&local_d09);
    bVar2 = sptk::ConvertStringToDouble
                      (in_stack_ffffffffffffde08,(double *)in_stack_ffffffffffffde00);
    std::__cxx11::string::~string(local_d08);
    std::allocator<char>::~allocator((allocator<char> *)&local_d09);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_e88);
      std::operator<<((ostream *)local_e88,"The argument for the -f option must be numeric");
      paVar6 = &local_ea9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ea8,"bcp",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_ea8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e88);
      goto LAB_00106ad2;
    }
    goto LAB_00104824;
  case 0x68:
    anon_unknown.dwarf_c7e9::PrintUsage(in_stack_ffffffffffffe140);
    local_4 = 0;
    local_238 = 1;
    goto LAB_00106ad2;
  case 0x6c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,pcVar1,&local_421);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_204a = !bVar2 || local_1c < 1;
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    if (local_204a) {
      std::__cxx11::ostringstream::ostringstream(local_5a0);
      std::operator<<((ostream *)local_5a0,
                      "The argument for the -l option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,"bcp",&local_5c1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_5a0);
      goto LAB_00106ad2;
    }
    goto LAB_00104824;
  case 0x6d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,pcVar1,&local_5e9);
    bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00)
    ;
    local_206a = !bVar2 || local_1c < 0;
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    if (local_206a) {
      std::__cxx11::ostringstream::ostringstream(local_768);
      poVar5 = std::operator<<((ostream *)local_768,"The argument for the -m option must be a ");
      std::operator<<(poVar5,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"bcp",&local_789);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_789);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_768);
      goto LAB_00106ad2;
    }
    local_1c = local_1c + 1;
    goto LAB_00104824;
  case 0x73:
    goto switchD_001048e3_caseD_73;
  }
LAB_001061c2:
  iVar4 = (int)in_stack_ffffffffffffdf00;
  if (local_153c < 1) goto LAB_00106464;
  local_1548 = *(char **)(local_10 + (long)(local_8 - local_153c) * 8);
  iVar4 = strncmp(local_1548,"+",1);
  pcVar1 = local_1548;
  if (iVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1568,pcVar1,&local_1569);
    std::allocator<char>::~allocator((allocator<char> *)&local_1569);
    std::__cxx11::string::substr((ulong)local_1590,(ulong)local_1568);
    std::__cxx11::string::operator=(local_50,local_1590);
    std::__cxx11::string::~string(local_1590);
    std::__cxx11::string::~string(local_1568);
  }
  else {
    if (local_1538 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1708);
      std::operator<<((ostream *)local_1708,"Too many input files");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1728,"bcp",&local_1729);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_1728);
      std::allocator<char>::~allocator((allocator<char> *)&local_1729);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1708);
      goto LAB_00106ad2;
    }
    local_1538 = local_1548;
  }
  local_153c = local_153c + -1;
  goto LAB_001061c2;
switchD_001048e3_caseD_73:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar1,&local_91);
  bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffde08,(int *)in_stack_ffffffffffffde00);
  local_1ffa = !bVar2 || local_14 < 0;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (local_1ffa) goto LAB_001049aa;
  goto LAB_00104824;
LAB_001049aa:
  std::__cxx11::ostringstream::ostringstream(local_210);
  poVar5 = std::operator<<((ostream *)local_210,"The argument for the -s option must be a ");
  std::operator<<(poVar5,"non-negative integer");
  paVar6 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"bcp",paVar6);
  sptk::PrintErrorMessage((string *)paVar6,(ostringstream *)in_stack_ffffffffffffdfe8);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  local_4 = 1;
  local_238 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_210);
  goto LAB_00106ad2;
LAB_00106464:
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_18a8);
    std::operator<<((ostream *)local_18a8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18c8,"bcp",&local_18c9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
    std::__cxx11::string::~string(local_18c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_18c9);
    local_4 = 1;
    local_238 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_18a8);
    goto LAB_00106ad2;
  }
  std::ifstream::ifstream(local_1ad8);
  pcVar1 = local_1538;
  if (local_1538 == (char *)0x0) {
LAB_00106764:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_21d8 = (char *)&std::cin;
    }
    else {
      local_21d8 = local_1ad8;
    }
    local_1c80 = local_21d8;
    anon_unknown.dwarf_c7e9::BlockCopyWrapper::BlockCopyWrapper
              (in_stack_ffffffffffffdef0,in_stack_ffffffffffffdee8,
               (int)((ulong)in_stack_ffffffffffffdee0 >> 0x20),(int)in_stack_ffffffffffffdee0,
               (int)((ulong)in_stack_ffffffffffffded8 >> 0x20),(int)in_stack_ffffffffffffded8,iVar4,
               in_stack_ffffffffffffded0);
    bVar2 = anon_unknown.dwarf_c7e9::BlockCopyWrapper::IsValid(&local_1c88);
    if (bVar2) {
      bVar2 = anon_unknown.dwarf_c7e9::BlockCopyWrapper::Run
                        ((BlockCopyWrapper *)
                         CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10),
                         (istream *)in_stack_ffffffffffffde08);
      if (bVar2) {
        local_4 = 0;
        local_238 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1fa0);
        std::operator<<((ostream *)local_1fa0,"Failed to copy");
        paVar6 = &local_1fc1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1fc0,"bcp",paVar6);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
        std::__cxx11::string::~string(local_1fc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1fc1);
        local_4 = 1;
        local_238 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1fa0);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e00);
      std::operator<<((ostream *)local_1e00,"Unexpected argument for the +type option");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e20,"bcp",&local_1e21);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
      std::__cxx11::string::~string(local_1e20);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
      local_4 = 1;
      local_238 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1e00);
    }
    anon_unknown.dwarf_c7e9::BlockCopyWrapper::~BlockCopyWrapper(in_stack_ffffffffffffde00);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1ad8,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00106764;
    std::__cxx11::ostringstream::ostringstream(local_1c50);
    poVar5 = std::operator<<((ostream *)local_1c50,"Cannot open file ");
    std::operator<<(poVar5,local_1538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c70,"bcp",&local_1c71);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdff0,(ostringstream *)in_stack_ffffffffffffdfe8);
    std::__cxx11::string::~string(local_1c70);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c71);
    local_4 = 1;
    local_238 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1c50);
  }
  std::ifstream::~ifstream(local_1ad8);
LAB_00106ad2:
  std::__cxx11::string::~string(local_50);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int input_start_number(kDefaultInputStartNumber);
  int input_end_number(kDefaultInputBlockLength - 1);
  int input_block_length(kDefaultInputBlockLength);
  int output_start_number(kDefaultOutputStartNumber);
  int output_block_length(kDefaultInputBlockLength);
  double pad_value(kDefaultPadValue);
  std::string data_type(kDefaultDataType);
  bool is_input_end_number_specified(false);
  bool is_output_block_length_specified(false);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "s:e:l:m:S:L:M:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &input_start_number) ||
            input_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &input_end_number) ||
            input_end_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_input_end_number_specified = true;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &input_block_length) ||
            input_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++input_block_length;
        break;
      }
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &output_start_number) ||
            output_start_number < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be a positive integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        is_output_block_length_specified = true;
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &output_block_length) ||
            output_block_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        ++output_block_length;
        is_output_block_length_specified = true;
        break;
      }
      case 'f': {
        if (!sptk::ConvertStringToDouble(optarg, &pad_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be numeric";
          sptk::PrintErrorMessage("bcp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!is_input_end_number_specified) {
    input_end_number = input_block_length - 1;
  } else if (input_block_length <= input_end_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  } else if (input_end_number < input_start_number) {
    std::ostringstream error_message;
    error_message << "End number " << input_end_number
                  << " must be equal to or greater than start number "
                  << input_start_number;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (input_block_length <= input_start_number) {
    std::ostringstream error_message;
    error_message << "Start number " << input_start_number
                  << " must be less than block length " << input_block_length;
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const int copy_length(input_end_number - input_start_number + 1);
  if (!is_output_block_length_specified) {
    output_block_length = output_start_number + copy_length;
  } else if (output_block_length < output_start_number + copy_length) {
    std::ostringstream error_message;
    error_message << "Output block length is too short";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("bcp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  BlockCopyWrapper block_copy(data_type, input_start_number, input_end_number,
                              input_block_length, output_start_number,
                              output_block_length, pad_value);

  if (!block_copy.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  if (!block_copy.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to copy";
    sptk::PrintErrorMessage("bcp", error_message);
    return 1;
  }

  return 0;
}